

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

size_t mwFreeUp(size_t needed,int urgent)

{
  mwData *pmVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  char *data;
  mwData *mw2;
  mwData *mw;
  void *p;
  int urgent_local;
  size_t needed_local;
  
  do {
    uVar2 = mwDrop_(1,0xfc,1);
    if (uVar2 == 0) {
      mw2 = mwHead;
      do {
        while( true ) {
          if (mw2 == (mwData *)0x0) {
            if (urgent == 0) {
              return 0;
            }
            do {
              uVar2 = mwDrop_(1,0xfb,1);
              if (uVar2 == 0) {
                return 0;
              }
              pvVar4 = malloc(needed);
            } while (pvVar4 == (void *)0x0);
            free(pvVar4);
            return needed;
          }
          if ((mw2->flag & 1) != 0) break;
          mw2 = mw2->next;
        }
        pvVar4 = (void *)((long)&mw2->prev + (long)mwOverflowZoneSize + (long)mwDataSize);
        pvVar3 = mwTestMem(pvVar4,(uint)mw2->size,0xfc);
        if (pvVar3 != (void *)0x0) {
          mwIncErr();
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mw2->count,
                  (long)pvVar4 + (long)mwOverflowZoneSize,mw2->file,(ulong)(uint)mw2->line);
        }
        pmVar1 = mw2->next;
        mwUnlink(mw2,"mwFreeUp",0);
        free(mw2);
        pvVar4 = malloc(needed);
        mw2 = pmVar1;
      } while (pvVar4 == (void *)0x0);
      free(pvVar4);
      return needed;
    }
    pvVar4 = malloc(needed);
  } while (pvVar4 == (void *)0x0);
  free(pvVar4);
  return needed;
}

Assistant:

static size_t mwFreeUp(size_t needed, int urgent)
{
	void *p;
	mwData *mw, *mw2;
	char *data;

	/* free grabbed NML memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_NML, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	/* free normal NML memory */
	mw = mwHead;
	while (mw != NULL) {
		if (!(mw->flag & MW_NML)) {
			mw = mw->next;
		} else {
			data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mw->size, MW_VAL_NML)) {
				mwIncErr();
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
			}
			mw2 = mw->next;
			mwUnlink(mw, "mwFreeUp", 0);
			free(mw);
			mw = mw2;
			p = malloc(needed);
			if (p == NULL) {
				continue;
			}
			free(p);
			return needed;
		}
	}

	/* if not urgent (for internal purposes), fail */
	if (!urgent) {
		return 0;
	}

	/* free grabbed memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_GRB, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	return 0;
}